

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  bool bVar12;
  int extraout_EAX;
  reference pSVar13;
  reference pLVar14;
  TestNode *pTVar15;
  char *pcVar16;
  StageType (*in_RDX) [3];
  LayoutBindingParameters (*data) [7];
  StageType stage;
  StageType stage_00;
  StageType stage_01;
  StageType stage_02;
  StageType stage_03;
  undefined1 local_90 [8];
  String testName;
  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
  local_68;
  iterator testArgsIter;
  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
  local_58;
  iterator stagesIter;
  undefined1 local_40 [8];
  vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_> samplers;
  vector<glcts::StageType,_std::allocator<glcts::StageType>_> stages;
  LayoutBindingTests *this_local;
  
  makeVector<glcts::StageType,3ul>
            ((vector<glcts::StageType,_std::allocator<glcts::StageType>_> *)
             &samplers.
              super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(glcts *)stageTypes,in_RDX);
  makeVector<glcts::LayoutBindingParameters,7ul>
            ((vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
              *)local_40,(glcts *)test_args,data);
  local_58._M_current =
       (StageType *)
       std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>::begin
                 ((vector<glcts::StageType,_std::allocator<glcts::StageType>_> *)
                  &samplers.
                   super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    testArgsIter._M_current =
         (LayoutBindingParameters *)
         std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>::end
                   ((vector<glcts::StageType,_std::allocator<glcts::StageType>_> *)
                    &samplers.
                     super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar12 = __gnu_cxx::operator!=
                       (&local_58,
                        (__normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                         *)&testArgsIter);
    if (!bVar12) break;
    local_68._M_current =
         (LayoutBindingParameters *)
         std::
         vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>::
         begin((vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                *)local_40);
    while( true ) {
      testName.field_2._8_8_ =
           std::
           vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>::
           end((vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                *)local_40);
      bVar12 = __gnu_cxx::operator!=
                         (&local_68,
                          (__normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                           *)((long)&testName.field_2 + 8));
      if (!bVar12) break;
      pSVar13 = __gnu_cxx::
                __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                ::operator*(&local_58);
      pLVar14 = __gnu_cxx::
                __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                ::operator*(&local_68);
      createTestName_abi_cxx11_((String *)local_90,this,pSVar13,pLVar14);
      pLVar14 = __gnu_cxx::
                __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                ::operator*(&local_68);
      switch(pLVar14->surface_type) {
      case AtomicCounter:
        pTVar15 = (TestNode *)operator_new(0x228);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar16 = (char *)std::__cxx11::string::c_str();
        pSVar13 = __gnu_cxx::
                  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                  ::operator*(&local_58);
        uVar6 = pSVar13->name;
        uVar7 = pSVar13->type;
        stage_01.type = uVar7;
        stage_01.name = (char *)uVar6;
        pLVar14 = __gnu_cxx::
                  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                  ::operator*(&local_68);
        stage_01._12_4_ = 0;
        AtomicCounterLayoutBindingCase::AtomicCounterLayoutBindingCase
                  ((AtomicCounterLayoutBindingCase *)pTVar15,pCVar1,pcVar16,
                   "test atomic counters layout binding functionality",stage_01,pLVar14,
                   this->m_glslVersion);
        tcu::TestNode::addChild((TestNode *)this,pTVar15);
        break;
      case Texture:
        pTVar15 = (TestNode *)operator_new(0x228);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar16 = (char *)std::__cxx11::string::c_str();
        pSVar13 = __gnu_cxx::
                  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                  ::operator*(&local_58);
        uVar2 = pSVar13->name;
        uVar3 = pSVar13->type;
        stage.type = uVar3;
        stage.name = (char *)uVar2;
        pLVar14 = __gnu_cxx::
                  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                  ::operator*(&local_68);
        stage._12_4_ = 0;
        SamplerLayoutBindingCase::SamplerLayoutBindingCase
                  ((SamplerLayoutBindingCase *)pTVar15,pCVar1,pcVar16,
                   "test sampler layout binding functionality",stage,pLVar14,this->m_glslVersion);
        tcu::TestNode::addChild((TestNode *)this,pTVar15);
        break;
      case Image:
        pTVar15 = (TestNode *)operator_new(0x228);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar16 = (char *)std::__cxx11::string::c_str();
        pSVar13 = __gnu_cxx::
                  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                  ::operator*(&local_58);
        uVar4 = pSVar13->name;
        uVar5 = pSVar13->type;
        stage_00.type = uVar5;
        stage_00.name = (char *)uVar4;
        pLVar14 = __gnu_cxx::
                  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                  ::operator*(&local_68);
        stage_00._12_4_ = 0;
        ImageLayoutBindingCase::ImageLayoutBindingCase
                  ((ImageLayoutBindingCase *)pTVar15,pCVar1,pcVar16,
                   "test image layout binding functionality",stage_00,pLVar14,this->m_glslVersion);
        tcu::TestNode::addChild((TestNode *)this,pTVar15);
        break;
      case UniformBlock:
        pTVar15 = (TestNode *)operator_new(0x228);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar16 = (char *)std::__cxx11::string::c_str();
        pSVar13 = __gnu_cxx::
                  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                  ::operator*(&local_58);
        uVar8 = pSVar13->name;
        uVar9 = pSVar13->type;
        stage_02.type = uVar9;
        stage_02.name = (char *)uVar8;
        pLVar14 = __gnu_cxx::
                  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                  ::operator*(&local_68);
        stage_02._12_4_ = 0;
        UniformBlocksLayoutBindingCase::UniformBlocksLayoutBindingCase
                  ((UniformBlocksLayoutBindingCase *)pTVar15,pCVar1,pcVar16,
                   "test uniform block layout binding functionality",stage_02,pLVar14,
                   this->m_glslVersion);
        tcu::TestNode::addChild((TestNode *)this,pTVar15);
        break;
      case ShaderStorageBuffer:
        pTVar15 = (TestNode *)operator_new(0x228);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar16 = (char *)std::__cxx11::string::c_str();
        pSVar13 = __gnu_cxx::
                  __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
                  ::operator*(&local_58);
        uVar10 = pSVar13->name;
        uVar11 = pSVar13->type;
        stage_03.type = uVar11;
        stage_03.name = (char *)uVar10;
        pLVar14 = __gnu_cxx::
                  __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
                  ::operator*(&local_68);
        stage_03._12_4_ = 0;
        ShaderStorageBufferLayoutBindingCase::ShaderStorageBufferLayoutBindingCase
                  ((ShaderStorageBufferLayoutBindingCase *)pTVar15,pCVar1,pcVar16,
                   "test shader storage buffer layout binding functionality",stage_03,pLVar14,
                   this->m_glslVersion);
        tcu::TestNode::addChild((TestNode *)this,pTVar15);
      }
      std::__cxx11::string::~string((string *)local_90);
      __gnu_cxx::
      __normal_iterator<glcts::LayoutBindingParameters_*,_std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>_>
      ::operator++(&local_68,0);
    }
    __gnu_cxx::
    __normal_iterator<glcts::StageType_*,_std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>::
  ~vector((vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_> *
          )local_40);
  std::vector<glcts::StageType,_std::allocator<glcts::StageType>_>::~vector
            ((vector<glcts::StageType,_std::allocator<glcts::StageType>_> *)
             &samplers.
              super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void LayoutBindingTests::init(void)
{
	std::vector<StageType>				 stages   = makeVector(stageTypes);
	std::vector<LayoutBindingParameters> samplers = makeVector(test_args);
	for (std::vector<StageType>::iterator stagesIter = stages.begin(); stagesIter != stages.end(); stagesIter++)
	{
		for (std::vector<LayoutBindingParameters>::iterator testArgsIter = samplers.begin();
			 testArgsIter != samplers.end(); testArgsIter++)
		{
			String testName = createTestName(*stagesIter, *testArgsIter);
			switch ((*testArgsIter).surface_type)
			{
			case Texture:
				addChild(new SamplerLayoutBindingCase(m_context, testName.c_str(),
													  "test sampler layout binding functionality", *stagesIter,
													  *testArgsIter, m_glslVersion));
				break;
			case Image:
				addChild(new ImageLayoutBindingCase(m_context, testName.c_str(),
													"test image layout binding functionality", *stagesIter,
													*testArgsIter, m_glslVersion));
				break;
			case AtomicCounter:
				addChild(new AtomicCounterLayoutBindingCase(m_context, testName.c_str(),
															"test atomic counters layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case UniformBlock:
				addChild(new UniformBlocksLayoutBindingCase(m_context, testName.c_str(),
															"test uniform block layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case ShaderStorageBuffer:
				addChild(new ShaderStorageBufferLayoutBindingCase(
					m_context, testName.c_str(), "test shader storage buffer layout binding functionality", *stagesIter,
					*testArgsIter, m_glslVersion));
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
	}
}